

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O2

void print_xml_help_option_element(ctmbstr element,ctmbstr name)

{
  char cVar1;
  ulong in_RAX;
  char *__s;
  size_t sVar2;
  ctmbstr ptVar3;
  int iVar4;
  int iVar5;
  undefined8 uStack_28;
  
  if (name == (ctmbstr)0x0) {
    return;
  }
  iVar4 = 0;
  ptVar3 = name;
  do {
    cVar1 = *ptVar3;
    if (cVar1 == '\"') {
      iVar5 = 6;
    }
    else {
      iVar5 = 4;
      if ((cVar1 != '<') && (cVar1 != '>')) {
        if (cVar1 == '\0') break;
        iVar5 = 1;
      }
    }
    iVar4 = iVar4 + iVar5;
    ptVar3 = ptVar3 + 1;
  } while( true );
  uStack_28 = in_RAX;
  __s = (char *)malloc((ulong)(iVar4 + 1));
  if (__s == (char *)0x0) {
    outOfMemory();
  }
  *__s = '\0';
  uStack_28 = uStack_28 & 0xffffffffffffff;
  do {
    cVar1 = *name;
    if (cVar1 == '\"') {
      sVar2 = strlen(__s);
      builtin_strncpy(__s + sVar2,"&quot;",7);
    }
    else {
      if (cVar1 == '<') {
        sVar2 = strlen(__s);
        builtin_strncpy(__s + sVar2,"&lt;",4);
      }
      else {
        if (cVar1 != '>') {
          if (cVar1 == '\0') {
            printf("  <%s>%s</%s>\n",element,__s,element);
            free(__s);
            return;
          }
          uStack_28._0_7_ = CONCAT16(cVar1,(undefined6)uStack_28);
          strcat(__s,(char *)((long)&uStack_28 + 6));
          goto LAB_0011bc55;
        }
        sVar2 = strlen(__s);
        builtin_strncpy(__s + sVar2,"&gt;",4);
      }
      __s[sVar2 + 4] = '\0';
    }
LAB_0011bc55:
    name = name + 1;
  } while( true );
}

Assistant:

static void print_xml_help_option_element( ctmbstr element, ctmbstr name )
{
    tmbstr escpName;
    if (!name)
        return;
    printf("  <%s>%s</%s>\n", element, escpName = get_escaped_name(name),
           element);
    free(escpName);
}